

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void handle_ping_frame(cio_websocket *websocket,uint8_t *data,uint_fast8_t length)

{
  size_t length_00;
  size_t frame_length;
  uint_fast8_t length_local;
  uint8_t *data_local;
  cio_websocket *websocket_local;
  
  cio_write_buffer_head_init(&(websocket->ws_private).ping_buffer.wb_head);
  if (length != '\0') {
    memcpy((websocket->ws_private).ping_buffer.buffer,data,(ulong)length);
    cio_write_buffer_element_init
              (&(websocket->ws_private).ping_buffer.write_buffer,
               (websocket->ws_private).ping_buffer.buffer,(ulong)length);
    cio_write_buffer_queue_tail
              (&(websocket->ws_private).ping_buffer.wb_head,
               &(websocket->ws_private).ping_buffer.write_buffer);
  }
  if (websocket->on_control !=
      (_func_void_cio_websocket_ptr_cio_websocket_frame_type_uint8_t_ptr_uint_fast8_t *)0x0) {
    (*websocket->on_control)(websocket,CIO_WEBSOCKET_PING_FRAME,data,length);
  }
  (websocket->ws_private).write_pong_job.wbh = &(websocket->ws_private).ping_buffer.wb_head;
  (websocket->ws_private).write_pong_job.handler = pong_frame_written;
  (websocket->ws_private).write_pong_job.handler_context = (void *)0x0;
  (websocket->ws_private).write_pong_job.frame_type = CIO_WEBSOCKET_PONG_FRAME;
  (websocket->ws_private).write_pong_job.last_frame = true;
  (websocket->ws_private).write_pong_job.stream_handler = message_written;
  length_00 = cio_write_buffer_get_total_size((websocket->ws_private).write_pong_job.wbh);
  enqueue_job(websocket,&(websocket->ws_private).write_pong_job,length_00);
  return;
}

Assistant:

static void handle_ping_frame(struct cio_websocket *websocket, const uint8_t *data, uint_fast8_t length)
{
	cio_write_buffer_head_init(&websocket->ws_private.ping_buffer.wb_head);
	if (length > 0) {
		memcpy(websocket->ws_private.ping_buffer.buffer, data, length);
		cio_write_buffer_element_init(&websocket->ws_private.ping_buffer.write_buffer, websocket->ws_private.ping_buffer.buffer, length);
		cio_write_buffer_queue_tail(&websocket->ws_private.ping_buffer.wb_head, &websocket->ws_private.ping_buffer.write_buffer);
	}

	if (websocket->on_control != NULL) {
		websocket->on_control(websocket, CIO_WEBSOCKET_PING_FRAME, data, length);
	}

	websocket->ws_private.write_pong_job.wbh = &websocket->ws_private.ping_buffer.wb_head;
	websocket->ws_private.write_pong_job.handler = pong_frame_written;
	websocket->ws_private.write_pong_job.handler_context = NULL;
	websocket->ws_private.write_pong_job.frame_type = CIO_WEBSOCKET_PONG_FRAME;
	websocket->ws_private.write_pong_job.last_frame = true;
	websocket->ws_private.write_pong_job.stream_handler = message_written;

	size_t frame_length = cio_write_buffer_get_total_size(websocket->ws_private.write_pong_job.wbh);
	enqueue_job(websocket, &websocket->ws_private.write_pong_job, frame_length);
}